

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSAtom JS_ValueToAtom(JSContext *ctx,JSValue val)

{
  JSRuntime *pJVar1;
  JSAtom JVar2;
  uint32_t *puVar3;
  uint uVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  JSValue JVar7;
  
  JVar5 = val.u;
  if ((int)val.u._0_4_ < 0 || (int)val.tag != 0) {
    if ((int)val.tag == -8) {
      pJVar1 = ctx->rt;
      uVar4 = (uint)((ulong)*(undefined8 *)((long)JVar5.ptr + 4) >> 0x20);
      if (uVar4 >> 0x1e < 3) {
        puVar3 = (uint32_t *)
                 ((ulong)((pJVar1->atom_hash_size - 1U & uVar4) << 2) + (long)pJVar1->atom_hash);
        do {
          uVar6 = (ulong)*puVar3;
          puVar3 = &pJVar1->atom_array[uVar6]->hash_next;
        } while (pJVar1->atom_array[uVar6] != (JSAtomStruct *)JVar5.ptr);
      }
      else {
        uVar6 = (ulong)*(uint32_t *)((long)JVar5.ptr + 0xc);
      }
      uVar4 = (uint)uVar6;
      if (0xd1 < (int)uVar4) {
        (pJVar1->atom_array[uVar6]->header).ref_count =
             (pJVar1->atom_array[uVar6]->header).ref_count + 1;
      }
    }
    else {
      JVar7 = JS_ToStringInternal(ctx,val,1);
      JVar5 = JVar7.u;
      if ((int)JVar7.tag == 6) {
        uVar4 = 0;
      }
      else {
        if ((int)JVar7.tag != -8) {
          JVar2 = JS_NewAtomStr((JSContext *)ctx->rt,(JSString *)JVar5.ptr);
          return JVar2;
        }
        uVar4 = (uint)((ulong)*(undefined8 *)((long)JVar5.ptr + 4) >> 0x20);
        if (uVar4 >> 0x1e < 3) {
          pJVar1 = ctx->rt;
          puVar3 = (uint32_t *)
                   ((ulong)((pJVar1->atom_hash_size - 1U & uVar4) << 2) + (long)pJVar1->atom_hash);
          do {
            uVar4 = *puVar3;
            puVar3 = &pJVar1->atom_array[uVar4]->hash_next;
          } while (pJVar1->atom_array[uVar4] != (JSString *)JVar5.ptr);
        }
        else {
          uVar4 = *(uint32_t *)((long)JVar5.ptr + 0xc);
        }
      }
    }
  }
  else {
    uVar4 = val.u._0_4_ | 0x80000000;
  }
  return uVar4;
}

Assistant:

JSAtom JS_ValueToAtom(JSContext *ctx, JSValueConst val)
{
    JSAtom atom;
    uint32_t tag;
    tag = JS_VALUE_GET_TAG(val);
    if (tag == JS_TAG_INT &&
        (uint32_t)JS_VALUE_GET_INT(val) <= JS_ATOM_MAX_INT) {
        /* fast path for integer values */
        atom = __JS_AtomFromUInt32(JS_VALUE_GET_INT(val));
    } else if (tag == JS_TAG_SYMBOL) {
        JSAtomStruct *p = JS_VALUE_GET_PTR(val);
        atom = JS_DupAtom(ctx, js_get_atom_index(ctx->rt, p));
    } else {
        JSValue str;
        str = JS_ToPropertyKey(ctx, val);
        if (JS_IsException(str))
            return JS_ATOM_NULL;
        if (JS_VALUE_GET_TAG(str) == JS_TAG_SYMBOL) {
            atom = js_symbol_to_atom(ctx, str);
        } else {
            atom = JS_NewAtomStr(ctx, JS_VALUE_GET_STRING(str));
        }
    }
    return atom;
}